

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O2

void findMatches(vector<extrema,_std::allocator<extrema>_> *ex1,
                vector<extrema,_std::allocator<extrema>_> *ex2,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP1,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP2,uint *cnt_match
                )

{
  pointer peVar1;
  pointer pdVar2;
  ostream *poVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pointer pvVar9;
  int l;
  long lVar10;
  int j;
  ulong uVar11;
  int i;
  double dVar12;
  pair<double,_int> pVar13;
  Point_<int> local_f8;
  int local_f0 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  everyDist;
  vector<int,_std::allocator<int>_> SecondMinIdx;
  vector<double,_std::allocator<double>_> everySecondMinDist;
  vector<double,_std::allocator<double>_> everyMinDist;
  vector<int,_std::allocator<int>_> MinIdx;
  
  everyDist.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  everyDist.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  everyDist.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(ex1->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(ex1->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                            super__Vector_impl_data._M_start) / 0x70); uVar7 = uVar7 + 1) {
    everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    for (uVar11 = 0;
        peVar1 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar11 < (ulong)(((long)(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl
                                .super__Vector_impl_data._M_finish - (long)peVar1) / 0x70);
        uVar11 = uVar11 + 1) {
      everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      lVar5 = *(long *)&peVar1[uVar11].NeighborCells.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl;
      pdVar2 = (pointer)0x0;
      for (lVar6 = 0;
          lVar6 != ((long)*(pointer *)
                           ((long)&peVar1[uVar11].NeighborCells.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl + 8) - lVar5) / 0x18; lVar6 = lVar6 + 1) {
        lVar8 = lVar6 * 0x18;
        for (lVar10 = 0; *(long *)(lVar5 + 8 + lVar8) - *(long *)(lVar5 + lVar8) >> 3 != lVar10;
            lVar10 = lVar10 + 1) {
          dVar12 = *(double *)
                    (*(long *)(*(long *)&(ex1->super__Vector_base<extrema,_std::allocator<extrema>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar7].
                                         NeighborCells.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + lVar8) + lVar10 * 8) -
                   *(double *)(*(long *)(lVar5 + lVar8) + lVar10 * 8);
          pdVar2 = (pointer)((double)pdVar2 + dVar12 * dVar12);
          everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = pdVar2;
        }
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 &everyMinDist.super__Vector_base<double,_std::allocator<double>_>,
                 (value_type_conflict2 *)&everySecondMinDist);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&everyDist,
                (value_type *)&everyMinDist.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&everyMinDist.super__Vector_base<double,_std::allocator<double>_>);
  }
  everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar5 = 0;
  uVar7 = 0;
  while( true ) {
    if ((ulong)(((long)everyDist.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)everyDist.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
    pVar13 = Min((vector<double,_std::allocator<double>_> *)
                 ((long)&((everyDist.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar5));
    SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)pVar13.first;
    SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_finish._4_4_,pVar13.second);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&everyMinDist,(double *)&SecondMinIdx);
    pVar13 = Min((vector<double,_std::allocator<double>_> *)
                 ((long)&((everyDist.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar5));
    SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)pVar13.first;
    SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_finish._4_4_,pVar13.second);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&MinIdx,(int *)&SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 0x18;
  }
  SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lVar5 = 0;
  lVar6 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)everyDist.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)everyDist.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1) {
    pVar13 = secondMin((vector<double,_std::allocator<double>_> *)
                       ((long)&((everyDist.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar6),
                       (int *)((long)MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar5));
    local_f8 = (Point_<int>)pVar13.first;
    local_f0[0] = pVar13.second;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&everySecondMinDist,(double *)&local_f8);
    pVar13 = secondMin((vector<double,_std::allocator<double>_> *)
                       ((long)&((everyDist.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar6),
                       (int *)((long)MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar5));
    local_f8 = (Point_<int>)pVar13.first;
    local_f0[0] = pVar13.second;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&SecondMinIdx,local_f0);
    lVar6 = lVar6 + 0x18;
    lVar5 = lVar5 + 4;
  }
  lVar5 = 0;
  pvVar4 = everyDist.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar9 = everyDist.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar7 = 0; uVar7 < (ulong)(((long)pvVar4 - (long)pvVar9) / 0x18); uVar7 = uVar7 + 1) {
    if ((everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7] < 1.0) ||
       (everyMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] /
        everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] < 0.8)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"(");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(float *)((long)&(((ex1->
                                                  super__Vector_base<extrema,_std::allocator<extrema>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->pt).x
                                           + lVar5));
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(float *)((long)&(((ex1->
                                                  super__Vector_base<extrema,_std::allocator<extrema>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->pt).y
                                           + lVar5));
      poVar3 = std::operator<<(poVar3,") match (");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>).
                                 _M_impl.super__Vector_impl_data._M_start
                                 [MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar7]].pt.x);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>).
                                 _M_impl.super__Vector_impl_data._M_start
                                 [MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar7]].pt.y);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
      peVar1 = (ex1->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.y = (int)ROUND(*(float *)((long)&(peVar1->pt).y + lVar5));
      local_f8.x = (int)ROUND(*(float *)((long)&(peVar1->pt).x + lVar5));
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)matchKP1,&local_f8);
      peVar1 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.y = (int)ROUND(peVar1[MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar7]].pt.y);
      local_f8.x = (int)ROUND(peVar1[MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar7]].pt.x);
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)matchKP2,&local_f8);
      *cnt_match = *cnt_match + 1;
      pvVar4 = everyDist.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar9 = everyDist.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    lVar5 = lVar5 + 0x70;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&MinIdx.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&everyMinDist.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&everyDist);
  return;
}

Assistant:

void findMatches(const vector<extrema>& ex1, const vector<extrema>& ex2, vector<Point>& matchKP1, vector<Point>& matchKP2, unsigned& cnt_match){
    double min_dist = 1000;
    for(const auto& i:ex1){
        for(const auto& j:ex2){
            double dist = 0;
            for(int k = 0; k < j.NeighborCells.size(); k++){
                for(int l = 0; l < j.NeighborCells[k].size(); l++){
                    dist += pow(i.NeighborCells[k][l] - j.NeighborCells[k][l], 2);
                }
            }
            if(dist < min_dist) min_dist = dist;
        }
    }

    vector<vector<double> > everyDist;
    for(int i = 0; i < ex1.size(); i++){
        vector<double> tmpEveryDist;
        for(int j = 0; j < ex2.size(); j++){
            double tmpSum = 0;
            for(int k = 0; k < ex2[j].NeighborCells.size(); k++){
                for(int l = 0; l < ex2[j].NeighborCells[k].size(); l++){
                    tmpSum += pow(ex1[i].NeighborCells[k][l] - ex2[j].NeighborCells[k][l], 2);
                }
            }
            tmpEveryDist.push_back(tmpSum);
        }
        everyDist.push_back(tmpEveryDist);
    }

    vector<double> everyMinDist, everySecondMinDist;
    vector<int> MinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everyMinDist.push_back(Min(everyDist[i]).first);
        MinIdx.push_back(Min(everyDist[i]).second);
    }
    vector<int> SecondMinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everySecondMinDist.push_back(secondMin(everyDist[i], MinIdx[i]).first);
        SecondMinIdx.push_back(secondMin(everyDist[i], MinIdx[i]).second);
    }
    for(int i = 0; i < everyDist.size(); i++){
        if(everyMinDist[i]/double(everySecondMinDist[i]) < match_ratio || everyMinDist[i] < 1 ){
            cout << "(" << ex1[i].pt.x << ", " << ex1[i].pt.y << ") match ("
                << ex2[MinIdx[i]].pt.x << ", " << ex2[MinIdx[i]].pt.y << ")" << endl;
            matchKP1.push_back(ex1[i].pt);
            matchKP2.push_back(ex2[MinIdx[i]].pt);
            cnt_match++;
        }
    }
}